

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

bool __thiscall
QStringListModel::setData(QStringListModel *this,QModelIndex *index,QVariant *value,int role)

{
  long lVar1;
  initializer_list<int> args;
  bool bVar2;
  int iVar3;
  parameter_type t;
  qsizetype qVar4;
  size_type sVar5;
  int in_ECX;
  QModelIndex *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QString valueString;
  QVariant *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QModelIndex *this_00;
  QList<QString> *in_stack_ffffffffffffff78;
  bool local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QModelIndex::row(in_RSI);
  if (-1 < iVar3) {
    iVar3 = QModelIndex::row(in_RSI);
    t = (parameter_type)(long)iVar3;
    qVar4 = QList<QString>::size((QList<QString> *)(in_RDI + 0x10));
    if (((long)t < qVar4) && ((in_ECX == 2 || (in_ECX == 0)))) {
      ::QVariant::toString(in_stack_ffffffffffffff38);
      QModelIndex::row(in_RSI);
      QList<QString>::at((QList<QString> *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         (qsizetype)in_stack_ffffffffffffff38);
      bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           (QString *)in_stack_ffffffffffffff38);
      if (!bVar2) {
        sVar5 = in_RDI + 0x10;
        QModelIndex::row(in_RSI);
        QList<QString>::replace(in_stack_ffffffffffffff78,in_RDI,t);
        args._M_len = sVar5;
        args._M_array = &in_RSI->r;
        this_00 = in_RSI;
        QList<int>::QList((QList<int> *)in_RSI,args);
        QAbstractItemModel::dataChanged
                  ((QAbstractItemModel *)this_00,in_RSI,
                   (QModelIndex *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   (QList<int> *)in_stack_ffffffffffffff38);
        QList<int>::~QList((QList<int> *)0x8bb18b);
      }
      local_41 = true;
      QString::~QString((QString *)0x8bb1df);
      goto LAB_008bb1f8;
    }
  }
  local_41 = false;
LAB_008bb1f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QStringListModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (index.row() >= 0 && index.row() < lst.size()
        && (role == Qt::EditRole || role == Qt::DisplayRole)) {
        const QString valueString = value.toString();
        if (lst.at(index.row()) == valueString)
            return true;
        lst.replace(index.row(), valueString);
        emit dataChanged(index, index, {Qt::DisplayRole, Qt::EditRole});
        return true;
    }
    return false;
}